

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_DCTDecode.hh
# Opt level: O2

Pipeline * __thiscall SF_DCTDecode::getDecodePipeline(SF_DCTDecode *this,Pipeline *next)

{
  __shared_ptr<Pl_DCT,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  Pipeline *local_18;
  
  local_18 = next;
  std::make_shared<Pl_DCT,char_const(&)[11],Pipeline*&>
            ((char (*) [11])&_Stack_28,(Pipeline **)"DCT decode");
  std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&this->pipeline,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return (this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

Pipeline*
    getDecodePipeline(Pipeline* next) override
    {
        this->pipeline = std::make_shared<Pl_DCT>("DCT decode", next);
        return this->pipeline.get();
    }